

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,GlobalInstanceVar *var)

{
  ExternalInstanceRef local_18;
  
  if (var->var->type_ == Name) {
    local_18.super_GlobalName.name = Var::name_abi_cxx11_(var->var);
    local_18.super_GlobalName.type = Global;
    Write(this,&local_18);
    return;
  }
  __assert_fail("var.var.is_name()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                ,0x40e,"void wabt::(anonymous namespace)::CWriter::Write(const GlobalInstanceVar &)"
               );
}

Assistant:

void CWriter::Write(const GlobalInstanceVar& var) {
  assert(var.var.is_name());
  Write(ExternalInstanceRef(ModuleFieldType::Global, var.var.name()));
}